

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::SaveBinsSummary
          (BamStandardIndex *this,int *refId,int *numBins)

{
  pointer pBVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  
  uVar4 = (ulong)*refId;
  pBVar1 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->m_indexFileSummary).
                 super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) *
          -0x5555555555555555;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    pBVar1[uVar4].NumBins = *numBins;
    iVar2 = (*((this->m_resources).Device)->_vptr_IBamIODevice[7])();
    pBVar1[uVar4].FirstBinFilePosition = CONCAT44(extraout_var,iVar2);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar3
            );
}

Assistant:

void BamStandardIndex::SaveBinsSummary(const int& refId, const int& numBins)
{
    BaiReferenceSummary& refSummary = m_indexFileSummary.at(refId);
    refSummary.NumBins = numBins;
    refSummary.FirstBinFilePosition = Tell();
}